

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O2

Location * __thiscall
trieste::Location::operator*(Location *__return_storage_ptr__,Location *this,Location *that)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  __shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (that->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    uVar3 = that->pos;
    uVar1 = this->pos;
    uVar2 = uVar1;
    if (uVar3 < uVar1) {
      uVar2 = uVar3;
    }
    uVar1 = uVar1 + this->len;
    uVar3 = uVar3 + that->len;
    if (uVar3 < uVar1) {
      uVar3 = uVar1;
    }
    std::__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2> *)
               __return_storage_ptr__,&local_30);
    __return_storage_ptr__->pos = uVar2;
    __return_storage_ptr__->len = uVar3 - uVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  else {
    Location(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Location operator*(const Location& that) const
    {
      if (source != that.source)
        return *this;

      auto lo = std::min(pos, that.pos);
      auto hi = std::max(pos + len, that.pos + that.len);
      return {source, lo, hi - lo};
    }